

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O0

void __thiscall
SplitCompilationTest_empty_deque_long_Test<unsigned_char>::
SplitCompilationTest_empty_deque_long_Test
          (SplitCompilationTest_empty_deque_long_Test<unsigned_char> *this)

{
  SplitCompilationTest_empty_deque_long_Test<unsigned_char> *this_local;
  
  SplitCompilationTest<unsigned_char>::SplitCompilationTest
            (&this->super_SplitCompilationTest<unsigned_char>);
  *(undefined ***)&this->super_SplitCompilationTest<unsigned_char> =
       &PTR__SplitCompilationTest_empty_deque_long_Test_00821388;
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_deque_long) {
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split<std::deque>(empty, delim).empty());
	EXPECT_TRUE(split_n<std::deque>(empty, delim, 5).empty());
	EXPECT_TRUE(split_view<std::deque>(empty, delim).empty());
	EXPECT_TRUE(split_n_view<std::deque>(empty, delim, 5).empty());
}